

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

string * __thiscall
cinatra::coro_http_server::build_range_header_abi_cxx11_
          (coro_http_server *this,string_view mime,string_view filename,string_view file_size_str,
          int status,string_view content_range)

{
  bool bVar1;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> __svt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *header_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s_00;
  int in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_32;
  
  __a = (allocator<char> *)&stack0x00000008;
  local_32._M_dataplus._M_p._1_1_ = 0;
  pbVar2 = &local_32;
  __s_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar2,(char *)__s_00,__a);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  std::__cxx11::to_string(in_stack_ffffffffffffff9c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(in_stack_ffffffffffffff50);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000020);
  if (!bVar1) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              (in_RDI,in_stack_ffffffffffffff68);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  __svt = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    (in_RDI,in_stack_ffffffffffffff68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  __s = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)__svt);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar2,(char *)__s);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar2,(char *)__s);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)__svt);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (pbVar2,(char *)__s);
  return in_RDI;
}

Assistant:

std::string build_range_header(std::string_view mime,
                                 std::string_view filename,
                                 std::string_view file_size_str,
                                 int status = 200,
                                 std::string_view content_range = "") {
    std::string header_str = "HTTP/1.1 ";
    header_str.append(std::to_string(status));
    header_str.append(
        " OK\r\nAccess-Control-Allow-origin: "
        "*\r\nAccept-Ranges: bytes\r\n");
    if (!content_range.empty()) {
      header_str.append(content_range);
    }
    header_str.append("Content-Disposition: attachment;filename=");
    header_str.append(filename).append("\r\n");
    header_str.append("Connection: keep-alive\r\n");
    header_str.append("Content-Type: ").append(mime).append("\r\n");
    header_str.append("Content-Length: ");
    header_str.append(file_size_str).append("\r\n\r\n");
    return header_str;
  }